

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O1

TestCaseGroup * vkt::tessellation::createUserDefinedIOTests(TestContext *testCtx)

{
  long lVar1;
  UserDefinedIOTest *node;
  TestNode *this;
  TestNode *this_00;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  anon_struct_16_2_d43fe070 *paVar5;
  char *__s;
  int *piVar6;
  TessPrimitiveType TVar7;
  CaseDefinition caseDef;
  string primitiveName;
  string local_150;
  TestNode *local_130;
  long local_128;
  long local_120;
  TestContext *local_118;
  TessPrimitiveType local_10c;
  TessPrimitiveType local_108;
  IOType IStack_104;
  VertexIOArraySize local_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  UserDefinedIOTest *local_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  string local_b0;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  anon_struct_24_3_0e327d44 *local_70;
  anon_struct_16_2_d43fe070 *local_68;
  undefined1 local_60 [16];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_130 = (TestNode *)operator_new(0x70);
  local_118 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_130,testCtx,"user_defined_io",
             "Test non-built-in per-patch and per-vertex inputs and outputs");
  local_128 = 0;
  do {
    this = (TestNode *)operator_new(0x70);
    lVar1 = local_128;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)this,local_118,createUserDefinedIOTests::ioCases[local_128].name,
               createUserDefinedIOTests::ioCases[local_128].description);
    local_70 = createUserDefinedIOTests::ioCases + lVar1;
    local_120 = 0;
    do {
      this_00 = (TestNode *)operator_new(0x70);
      lVar1 = local_120;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)this_00,local_118,
                 createUserDefinedIOTests::vertexArraySizeCases[local_120].name,"");
      paVar5 = createUserDefinedIOTests::vertexArraySizeCases + lVar1;
      TVar7 = TESSPRIMITIVETYPE_TRIANGLES;
      piVar6 = &DAT_00b78798;
      local_68 = paVar5;
      do {
        if (TVar7 < TESSPRIMITIVETYPE_LAST) {
          __s = (char *)((long)&DAT_00b78798 + (long)*piVar6);
        }
        else {
          __s = (char *)0x0;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,__s,(allocator<char> *)&local_108);
        IStack_104 = local_70->ioType;
        local_100 = paVar5->vertexIOArraySize;
        local_88 = 0;
        local_80 = 0;
        local_108 = TVar7;
        local_90 = &local_80;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
        plVar3 = plVar2 + 2;
        if ((long *)*plVar2 == plVar3) {
          local_c0 = *plVar3;
          lStack_b8 = plVar2[3];
          local_d0 = &local_c0;
        }
        else {
          local_c0 = *plVar3;
          local_d0 = (long *)*plVar2;
        }
        local_c8 = plVar2[1];
        *plVar2 = (long)plVar3;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_d0,(ulong)local_b0._M_dataplus._M_p);
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        psVar4 = (size_type *)(plVar2 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar4) {
          local_150.field_2._M_allocated_capacity = *psVar4;
          local_150.field_2._8_8_ = plVar2[3];
        }
        else {
          local_150.field_2._M_allocated_capacity = *psVar4;
          local_150._M_dataplus._M_p = (pointer)*plVar2;
        }
        local_150._M_string_length = plVar2[1];
        *plVar2 = (long)psVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_150);
        local_f8 = &local_e8;
        plVar3 = plVar2 + 2;
        if ((long *)*plVar2 == plVar3) {
          local_e8 = *plVar3;
          lStack_e0 = plVar2[3];
        }
        else {
          local_e8 = *plVar3;
          local_f8 = (long *)*plVar2;
        }
        local_f0 = plVar2[1];
        *plVar2 = (long)plVar3;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        if (local_d0 != &local_c0) {
          operator_delete(local_d0,local_c0 + 1);
        }
        if (local_90 != &local_80) {
          operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
        }
        local_d8 = (UserDefinedIOTest *)operator_new(0x168);
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"");
        local_60._8_4_ = local_100;
        local_60._4_4_ = IStack_104;
        local_60._0_4_ = local_108;
        local_50._M_p = (pointer)&local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,local_f8,local_f0 + (long)local_f8);
        node = local_d8;
        local_10c = TVar7;
        anon_unknown_1::UserDefinedIOTest::UserDefinedIOTest
                  (local_d8,local_118,&local_b0,&local_150,(CaseDefinition *)local_60);
        tcu::TestNode::addChild(this_00,(TestNode *)node);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_p != &local_40) {
          operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
        }
        paVar5 = local_68;
        TVar7 = local_10c;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        if (local_f8 != &local_e8) {
          operator_delete(local_f8,local_e8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        TVar7 = TVar7 + TESSPRIMITIVETYPE_QUADS;
        piVar6 = piVar6 + 1;
      } while (TVar7 != TESSPRIMITIVETYPE_LAST);
      tcu::TestNode::addChild(this,this_00);
      local_120 = local_120 + 1;
    } while (local_120 != 3);
    tcu::TestNode::addChild(local_130,this);
    local_128 = local_128 + 1;
  } while (local_128 != 6);
  return (TestCaseGroup *)local_130;
}

Assistant:

tcu::TestCaseGroup* createUserDefinedIOTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group (new tcu::TestCaseGroup(testCtx, "user_defined_io", "Test non-built-in per-patch and per-vertex inputs and outputs"));

	static const struct
	{
		const char*	name;
		const char*	description;
		IOType		ioType;
	} ioCases[] =
	{
		{ "per_patch",					"Per-patch TCS outputs",					IO_TYPE_PER_PATCH				},
		{ "per_patch_array",			"Per-patch array TCS outputs",				IO_TYPE_PER_PATCH_ARRAY			},
		{ "per_patch_block",			"Per-patch TCS outputs in IO block",		IO_TYPE_PER_PATCH_BLOCK			},
		{ "per_patch_block_array",		"Per-patch TCS outputs in IO block array",	IO_TYPE_PER_PATCH_BLOCK_ARRAY	},
		{ "per_vertex",					"Per-vertex TCS outputs",					IO_TYPE_PER_VERTEX				},
		{ "per_vertex_block",			"Per-vertex TCS outputs in IO block",		IO_TYPE_PER_VERTEX_BLOCK		},
	};

	static const struct
	{
		const char*			name;
		VertexIOArraySize	vertexIOArraySize;
	} vertexArraySizeCases[] =
	{
		{ "vertex_io_array_size_implicit",			VERTEX_IO_ARRAY_SIZE_IMPLICIT					},
		{ "vertex_io_array_size_shader_builtin",	VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN	},
		{ "vertex_io_array_size_spec_min",			VERTEX_IO_ARRAY_SIZE_EXPLICIT_SPEC_MIN			},
	};

	for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(ioCases); ++caseNdx)
	{
		de::MovePtr<tcu::TestCaseGroup> ioTypeGroup (new tcu::TestCaseGroup(testCtx, ioCases[caseNdx].name, ioCases[caseNdx].description));
		for (int arrayCaseNdx = 0; arrayCaseNdx < DE_LENGTH_OF_ARRAY(vertexArraySizeCases); ++arrayCaseNdx)
		{
			de::MovePtr<tcu::TestCaseGroup> vertexArraySizeGroup (new tcu::TestCaseGroup(testCtx, vertexArraySizeCases[arrayCaseNdx].name, ""));
			for (int primitiveTypeNdx = 0; primitiveTypeNdx < TESSPRIMITIVETYPE_LAST; ++primitiveTypeNdx)
			{
				const TessPrimitiveType primitiveType = static_cast<TessPrimitiveType>(primitiveTypeNdx);
				const std::string		primitiveName = getTessPrimitiveTypeShaderName(primitiveType);
				const CaseDefinition	caseDef		  = { primitiveType, ioCases[caseNdx].ioType, vertexArraySizeCases[arrayCaseNdx].vertexIOArraySize,
														  std::string() + "vulkan/data/tessellation/user_defined_io_" + primitiveName + "_ref.png" };

				vertexArraySizeGroup->addChild(new UserDefinedIOTest(testCtx, primitiveName, "", caseDef));
			}
			ioTypeGroup->addChild(vertexArraySizeGroup.release());
		}
		group->addChild(ioTypeGroup.release());
	}

	return group.release();
}